

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::BasicReporter::StartGroup(BasicReporter *this,string *groupName)

{
  pointer pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  bool local_20;
  
  pcVar1 = (groupName->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + groupName->_M_string_length);
  local_20 = false;
  std::__cxx11::string::_M_assign((string *)&this->m_groupSpan);
  (this->m_groupSpan).emitted = local_20;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_groupSpan = groupName;
        }